

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O0

void ncnn::convolution_transform_kernel_packed_int8_sse
               (Mat *weight_data,Mat *weight_data_tm,int num_input,int num_output,int kernel_w,
               int kernel_h,int elempack,int out_elempack)

{
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  char *k00;
  int j;
  int i;
  int k;
  int p;
  char *g00;
  int q;
  Mat weight_data_r2;
  int maxk;
  Mat *m_1;
  Mat *m;
  undefined8 in_stack_fffffffffffffce0;
  size_t in_stack_fffffffffffffce8;
  undefined8 in_stack_fffffffffffffcf0;
  int _c;
  undefined8 in_stack_fffffffffffffcf8;
  Mat *in_stack_fffffffffffffd00;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  int local_278;
  int local_274;
  int local_270;
  int local_26c;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined4 local_250;
  long local_248;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  int in_stack_fffffffffffffdcc;
  int in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  Mat *in_stack_fffffffffffffdd8;
  undefined1 *local_220;
  int local_218;
  void *local_208;
  int *local_200;
  long local_1f8;
  long *local_1e8;
  int local_1dc;
  int local_1d8;
  long local_1c8;
  int local_1bc;
  int local_1b0;
  int local_1ac;
  long *local_1a8;
  undefined8 *local_198;
  undefined8 *local_190;
  void **local_188;
  int local_168;
  undefined4 local_164;
  void **local_160;
  undefined8 *local_150;
  undefined8 *local_140;
  undefined1 local_135;
  int local_134;
  void **local_130;
  undefined8 *local_128;
  undefined1 local_105;
  int local_104;
  undefined8 *local_f8;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined1 *local_90;
  undefined4 local_84;
  int local_80;
  int local_7c;
  undefined8 *local_78;
  void *local_58;
  undefined8 *local_40;
  undefined4 local_34;
  long local_30;
  undefined4 local_24;
  long local_20;
  undefined8 *local_18;
  int local_c;
  undefined8 *local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20);
  local_1bc = in_R8D * in_R9D;
  local_1b0 = in_ECX;
  local_1ac = in_EDX;
  local_1a8 = in_RSI;
  Mat::reshape(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0,
               in_stack_fffffffffffffdcc,
               (Allocator *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  Mat::create(in_stack_fffffffffffffd00,(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
              (int)in_stack_fffffffffffffcf8,_c,in_stack_fffffffffffffce8,
              (int)((ulong)in_stack_fffffffffffffce0 >> 0x20),
              (Allocator *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  for (local_218 = 0; local_218 + in_stack_00000010 + -1 < local_1b0;
      local_218 = in_stack_00000010 + local_218) {
    local_104 = local_218 / in_stack_00000010;
    local_f8 = &local_268;
    local_7c = *(int *)((long)local_1a8 + 0x2c);
    local_80 = (int)local_1a8[6];
    local_84 = *(undefined4 *)((long)local_1a8 + 0x34);
    local_90 = (undefined1 *)(*local_1a8 + local_1a8[8] * (long)local_104 * local_1a8[2]);
    local_98 = local_1a8[2];
    local_9c = (undefined4)local_1a8[3];
    local_a8 = local_1a8[4];
    local_78 = &local_268;
    local_20 = (long)local_7c * (long)local_80 * local_98;
    local_18 = &local_268;
    local_198 = &local_268;
    local_24 = 0x10;
    local_105 = 1;
    local_268 = 0;
    local_258 = 0;
    local_250 = 0;
    local_260 = 0;
    local_220 = local_90;
    for (local_26c = 0; local_26c + in_stack_00000008 + -1 < local_1ac;
        local_26c = in_stack_00000008 + local_26c) {
      for (local_270 = 0; local_270 < local_1bc; local_270 = local_270 + 1) {
        for (local_274 = 0; local_274 < in_stack_00000010; local_274 = local_274 + 1) {
          for (local_278 = 0; local_278 < in_stack_00000008; local_278 = local_278 + 1) {
            local_134 = local_218 + local_274;
            local_128 = &local_2c8;
            local_130 = &local_208;
            local_58 = (void *)((long)local_208 + local_1c8 * local_134 * local_1f8);
            local_40 = &local_2c8;
            local_30 = (long)local_1dc * (long)local_1d8 * local_1f8;
            local_c = local_26c + local_278;
            local_8 = &local_2c8;
            local_190 = &local_2c8;
            local_34 = 0x10;
            local_135 = 1;
            local_2c8 = 0;
            local_2c0 = 0;
            *local_220 = *(undefined1 *)
                          ((long)local_58 +
                          (long)local_270 + (long)local_1dc * (long)local_c * local_1f8);
            local_220 = local_220 + 1;
            local_150 = local_190;
          }
        }
      }
    }
    local_140 = local_198;
    local_248 = local_a8;
  }
  local_188 = &local_208;
  if (local_200 != (int *)0x0) {
    local_164 = 0xffffffff;
    LOCK();
    local_168 = *local_200;
    *local_200 = *local_200 + -1;
    UNLOCK();
    if (local_168 == 1) {
      local_160 = local_188;
      if (local_1e8 == (long *)0x0) {
        if (local_208 != (void *)0x0) {
          free(local_208);
        }
      }
      else {
        (**(code **)(*local_1e8 + 0x18))(local_1e8,local_208);
      }
    }
  }
  return;
}

Assistant:

static void convolution_transform_kernel_packed_int8_sse(const Mat& weight_data, Mat& weight_data_tm, int num_input, int num_output, int kernel_w, int kernel_h, int elempack, int out_elempack)
{
    const int maxk = kernel_w * kernel_h;

    // src = kw-kh-inch-outch
    // dst = pa-pb-kw-kh-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            signed char* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < out_elempack; i++)
                    {
                        for (int j = 0; j < elempack; j++)
                        {
                            const signed char* k00 = weight_data_r2.channel(q + i).row<const signed char>(p + j);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }
}